

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_vector.c
# Opt level: O0

exr_result_t
exr_attr_string_vector_add_entry_with_length
          (exr_context_t ctxt,exr_attr_string_vector_t *sv,char *s,int32_t len)

{
  int iVar1;
  exr_result_t eVar2;
  char *d;
  undefined4 in_ECX;
  undefined8 *puVar3;
  int *in_RSI;
  long in_RDI;
  int32_t i;
  int32_t allsz;
  size_t bytes;
  exr_attr_string_t *nlist;
  int rv;
  int32_t nent;
  int local_48;
  int local_44;
  long in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  exr_result_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else if (in_RSI == (int *)0x0) {
    local_4 = (**(code **)(in_RDI + 0x40))
                        (in_RDI,3,"Invalid reference to string vector object to assign to");
  }
  else {
    iVar1 = *in_RSI + 1;
    if (in_RSI[1] < iVar1) {
      local_44 = in_RSI[1] << 1;
      if (0x7fffffe < in_RSI[1]) {
        eVar2 = (**(code **)(in_RDI + 0x38))(in_RDI,1);
        return eVar2;
      }
      if (local_44 < iVar1) {
        local_44 = *in_RSI + 2;
      }
      in_stack_ffffffffffffffc0 = (long)local_44 << 4;
      d = (char *)(**(code **)(in_RDI + 0x58))(in_stack_ffffffffffffffc0);
      if (d == (char *)0x0) {
        eVar2 = (**(code **)(in_RDI + 0x38))(in_RDI,1);
        return eVar2;
      }
      for (local_48 = 0; local_48 < *in_RSI; local_48 = local_48 + 1) {
        puVar3 = (undefined8 *)(*(long *)(in_RSI + 2) + (long)local_48 * 0x10);
        *(undefined8 *)(d + (long)local_48 * 0x10) = *puVar3;
        *(undefined8 *)(d + (long)local_48 * 0x10 + 8) = puVar3[1];
      }
      if (0 < in_RSI[1]) {
        (**(code **)(in_RDI + 0x60))(*(undefined8 *)(in_RSI + 2));
      }
      *(char **)(in_RSI + 2) = d;
      in_RSI[1] = local_44;
    }
    else {
      d = *(char **)(in_RSI + 2);
    }
    local_4 = exr_attr_string_create_with_length
                        ((exr_context_t)CONCAT44(in_ECX,iVar1),
                         (exr_attr_string_t *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),d,
                         (int32_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    if (local_4 == 0) {
      *in_RSI = iVar1;
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_string_vector_add_entry_with_length (
    exr_context_t             ctxt,
    exr_attr_string_vector_t* sv,
    const char*               s,
    int32_t                   len)
{
    int32_t            nent;
    int                rv;
    exr_attr_string_t* nlist;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!sv)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to string vector object to assign to");

    nent = sv->n_strings + 1;
    if (nent > sv->alloc_size)
    {
        size_t  bytes;
        int32_t allsz = sv->alloc_size * 2;

        if (sv->alloc_size >= (INT32_MAX / (int) sizeof (exr_attr_string_t)))
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);

        if (nent > allsz) allsz = nent + 1;
        bytes = ((size_t) allsz) * sizeof (exr_attr_string_t);
        nlist = (exr_attr_string_t*) ctxt->alloc_fn (bytes);
        if (nlist == NULL)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);

        for (int32_t i = 0; i < sv->n_strings; ++i)
            *(nlist + i) = sv->strings[i];

        if (sv->alloc_size > 0)
            ctxt->free_fn (EXR_CONST_CAST (void*, sv->strings));
        sv->strings    = nlist;
        sv->alloc_size = allsz;
    }
    else
    {
        /* that means we own this and can write into, cast away const */
        nlist = EXR_CONST_CAST (exr_attr_string_t*, sv->strings);
    }

    rv = exr_attr_string_create_with_length (
        ctxt, nlist + sv->n_strings, s, len);
    if (rv == EXR_ERR_SUCCESS) sv->n_strings = nent;
    return rv;
}